

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyLoader.cpp
# Opt level: O1

void __thiscall
Assimp::PLYImporter::InternReadFile
          (PLYImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  aiMesh *paVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  runtime_error *prVar8;
  aiMaterial **ppaVar9;
  ulong uVar10;
  aiMesh **ppaVar11;
  aiNode *paVar12;
  uint *puVar13;
  long *plVar14;
  size_t *psVar15;
  byte *__s2;
  string defaultTexture;
  IOStreamBuffer<char> streamedBuffer;
  DOM sPlyDom;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> avMaterials;
  vector<char,_std::allocator<char>_> headerCheck;
  vector<char,_std::allocator<char>_> mBuffer2;
  string mode;
  string local_148;
  IOStreamBuffer<char> local_128;
  undefined1 local_d8 [16];
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  vector<char,_std::allocator<char>_> local_88;
  vector<char,_std::allocator<char>_> local_68;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  IOStream *pIVar7;
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"rb","");
  iVar6 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_50[0]);
  pIVar7 = (IOStream *)CONCAT44(extraout_var,iVar6);
  if (pIVar7 == (IOStream *)0x0) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   "Failed to open file ",pFile);
    plVar14 = (long *)std::__cxx11::string::append(local_d8);
    local_128.m_stream = (IOStream *)*plVar14;
    psVar15 = (size_t *)(plVar14 + 2);
    if (local_128.m_stream == (IOStream *)psVar15) {
      local_128.m_cacheSize = *psVar15;
      local_128.m_numBlocks = plVar14[3];
      local_128.m_stream = (IOStream *)&local_128.m_cacheSize;
    }
    else {
      local_128.m_cacheSize = *psVar15;
    }
    local_128.m_filesize = plVar14[1];
    *plVar14 = (long)psVar15;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::runtime_error::runtime_error(prVar8,(string *)&local_128);
    *(undefined ***)prVar8 = &PTR__runtime_error_0081d260;
    __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar6 = (*pIVar7->_vptr_IOStream[6])(pIVar7);
  if (CONCAT44(extraout_var_00,iVar6) == 0) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   "File ",pFile);
    plVar14 = (long *)std::__cxx11::string::append(local_d8);
    local_128.m_stream = (IOStream *)*plVar14;
    psVar15 = (size_t *)(plVar14 + 2);
    if (local_128.m_stream == (IOStream *)psVar15) {
      local_128.m_cacheSize = *psVar15;
      local_128.m_numBlocks = plVar14[3];
      local_128.m_stream = (IOStream *)&local_128.m_cacheSize;
    }
    else {
      local_128.m_cacheSize = *psVar15;
    }
    local_128.m_filesize = plVar14[1];
    *plVar14 = (long)psVar15;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::runtime_error::runtime_error(prVar8,(string *)&local_128);
    *(undefined ***)prVar8 = &PTR__runtime_error_0081d260;
    __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_128.m_stream = (IOStream *)0x0;
  local_128.m_filesize = 0;
  local_128.m_cacheSize = (size_t)&StreamWriter<false,_false>::StreamWriter;
  local_128.m_numBlocks = 0;
  local_128.m_blockIdx = 0;
  local_128.m_cache.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_128.m_cache.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_128.m_cache.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_128.m_cachePos = 0;
  local_128.m_filePos = 0;
  std::vector<char,_std::allocator<char>_>::resize(&local_128.m_cache,0x100000);
  if ((long)local_128.m_cache.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_128.m_cache.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    memset(local_128.m_cache.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start,10,
           (long)local_128.m_cache.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_128.m_cache.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
  }
  if (local_128.m_stream == (IOStream *)0x0) {
    local_128.m_stream = pIVar7;
    iVar6 = (*pIVar7->_vptr_IOStream[6])(pIVar7);
    local_128.m_filesize = CONCAT44(extraout_var_01,iVar6);
    if ((Elf64_Ehdr *)local_128.m_filesize != (Elf64_Ehdr *)0x0) {
      if (local_128.m_filesize < local_128.m_cacheSize) {
        local_128.m_cacheSize = local_128.m_filesize;
      }
      local_128.m_numBlocks =
           (local_128.m_filesize / local_128.m_cacheSize + 1) -
           (ulong)(local_128.m_filesize % local_128.m_cacheSize == 0);
    }
  }
  local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  IOStreamBuffer<char>::getNextLine(&local_128,&local_88);
  if (((((ulong)((long)local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start) < 3) ||
       ((byte)(*local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start | 0x20U) != 0x70)) ||
      ((byte)(local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[1] | 0x20U) != 0x6c)) ||
     ((byte)(local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start[2] | 0x20U) != 0x79)) {
    if (local_128.m_stream != (IOStream *)0x0) {
      local_128.m_stream = (IOStream *)0x0;
      local_128.m_filesize = 0;
      local_128.m_numBlocks = 0;
      local_128.m_blockIdx = 0;
      local_128.m_cachePos = 0;
      local_128.m_filePos = 0;
    }
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_d8._0_8_ = local_c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"Invalid .ply file: Magic number \'ply\' is no there","");
    std::runtime_error::runtime_error(prVar8,(string *)local_d8);
    *(undefined ***)prVar8 = &PTR__runtime_error_0081d260;
    __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  IOStreamBuffer<char>::getNextLine(&local_128,&local_68);
  this->mBuffer =
       (uchar *)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  __s2 = (byte *)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  while (((ulong)*__s2 < 0x21 && ((0x100002600U >> ((ulong)*__s2 & 0x3f) & 1) != 0))) {
    __s2 = __s2 + 1;
  }
  local_c8._16_8_ = (pointer)0x0;
  local_c8._24_8_ = (pointer)0x0;
  local_c8._0_8_ = (pointer)0x0;
  local_c8._8_8_ = (pointer)0x0;
  local_d8._0_8_ = (pointer)0x0;
  local_d8._8_8_ = (pointer)0x0;
  this->pcDOM = (DOM *)local_d8;
  iVar6 = strncmp("format",(char *)__s2,6);
  if (iVar6 == 0) {
    bVar2 = __s2[6];
    if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
      pbVar1 = __s2 + 6;
      __s2 = __s2 + 7;
      if (bVar2 == 0) {
        __s2 = pbVar1;
      }
      bVar5 = true;
      goto LAB_0049387e;
    }
  }
  bVar5 = false;
LAB_0049387e:
  if (!bVar5) {
    this->mBuffer = (uchar *)0x0;
    paVar4 = this->mGeneratedMesh;
    if (paVar4 != (aiMesh *)0x0) {
      aiMesh::~aiMesh(paVar4);
      operator_delete(paVar4);
      this->mGeneratedMesh = (aiMesh *)0x0;
    }
    if (local_128.m_stream != (IOStream *)0x0) {
      local_128.m_stream = (IOStream *)0x0;
      local_128.m_filesize = 0;
      local_128.m_numBlocks = 0;
      local_128.m_blockIdx = 0;
      local_128.m_cachePos = 0;
      local_128.m_filePos = 0;
    }
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,"Invalid .ply file: Missing format specification","");
    std::runtime_error::runtime_error(prVar8,(string *)&local_148);
    *(undefined ***)prVar8 = &PTR__runtime_error_0081d260;
    __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar6 = strncmp("ascii",(char *)__s2,5);
  if (iVar6 == 0) {
    bVar2 = __s2[5];
    bVar5 = false;
    if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
      pbVar1 = __s2 + 5;
      __s2 = __s2 + 6;
      if (bVar2 == 0) {
        __s2 = pbVar1;
      }
      bVar5 = true;
    }
  }
  else {
    bVar5 = false;
  }
  if (bVar5) {
    bVar5 = PLY::DOM::ParseInstance(&local_128,(DOM *)local_d8,this);
    if (!bVar5) {
      paVar4 = this->mGeneratedMesh;
      if (paVar4 != (aiMesh *)0x0) {
        aiMesh::~aiMesh(paVar4);
        operator_delete(paVar4);
        this->mGeneratedMesh = (aiMesh *)0x0;
      }
      if (local_128.m_stream != (IOStream *)0x0) {
        local_128.m_stream = (IOStream *)0x0;
        local_128.m_filesize = 0;
        local_128.m_numBlocks = 0;
        local_128.m_blockIdx = 0;
        local_128.m_cachePos = 0;
        local_128.m_filePos = 0;
      }
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,"Invalid .ply file: Unable to build DOM (#1)","");
      std::runtime_error::runtime_error(prVar8,(string *)&local_148);
      *(undefined ***)prVar8 = &PTR__runtime_error_0081d260;
      __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    iVar6 = strncmp((char *)__s2,"binary_",7);
    if (iVar6 != 0) {
      paVar4 = this->mGeneratedMesh;
      if (paVar4 != (aiMesh *)0x0) {
        aiMesh::~aiMesh(paVar4);
        operator_delete(paVar4);
        this->mGeneratedMesh = (aiMesh *)0x0;
      }
      if (local_128.m_stream != (IOStream *)0x0) {
        local_128.m_stream = (IOStream *)0x0;
        local_128.m_filesize = 0;
        local_128.m_numBlocks = 0;
        local_128.m_blockIdx = 0;
        local_128.m_cachePos = 0;
        local_128.m_filePos = 0;
      }
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,"Invalid .ply file: Unknown file format","");
      std::runtime_error::runtime_error(prVar8,(string *)&local_148);
      *(undefined ***)prVar8 = &PTR__runtime_error_0081d260;
      __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar5 = PLY::DOM::ParseInstanceBinary
                      (&local_128,(DOM *)local_d8,this,(__s2[7] + 0xbe & 0xdf) == 0);
    if (!bVar5) {
      paVar4 = this->mGeneratedMesh;
      if (paVar4 != (aiMesh *)0x0) {
        aiMesh::~aiMesh(paVar4);
        operator_delete(paVar4);
        this->mGeneratedMesh = (aiMesh *)0x0;
      }
      if (local_128.m_stream != (IOStream *)0x0) {
        local_128.m_stream = (IOStream *)0x0;
        local_128.m_filesize = 0;
        local_128.m_numBlocks = 0;
        local_128.m_blockIdx = 0;
        local_128.m_cachePos = 0;
        local_128.m_filePos = 0;
      }
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,"Invalid .ply file: Unable to build DOM (#2)","");
      std::runtime_error::runtime_error(prVar8,(string *)&local_148);
      *(undefined ***)prVar8 = &PTR__runtime_error_0081d260;
      __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if (local_128.m_stream != (IOStream *)0x0) {
    local_128.m_stream = (IOStream *)0x0;
    local_128.m_filesize = 0;
    local_128.m_numBlocks = 0;
    local_128.m_blockIdx = 0;
    local_128.m_cachePos = 0;
    local_128.m_filePos = 0;
  }
  paVar4 = this->mGeneratedMesh;
  if (paVar4 != (aiMesh *)0x0) {
    if (paVar4->mFaces == (aiFace *)0x0) {
      paVar4->mPrimitiveTypes = 1;
    }
    local_a8._0_8_ = (pointer)0x0;
    local_a8._8_8_ = (pointer)0x0;
    local_a8._16_8_ = (pointer)0x0;
    local_148._M_string_length = 0;
    local_148.field_2._M_local_buf[0] = '\0';
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    LoadMaterial(this,(vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)local_a8,&local_148,
                 paVar4->mFaces == (aiFace *)0x0);
    pScene->mNumMaterials = (uint)((ulong)(local_a8._8_8_ - local_a8._0_8_) >> 3);
    ppaVar9 = (aiMaterial **)operator_new__(local_a8._8_8_ - local_a8._0_8_ & 0x7fffffff8);
    pScene->mMaterials = ppaVar9;
    if (pScene->mNumMaterials != 0) {
      uVar10 = 0;
      do {
        pScene->mMaterials[uVar10] = *(aiMaterial **)(local_a8._0_8_ + uVar10 * 8);
        uVar10 = uVar10 + 1;
      } while (uVar10 < pScene->mNumMaterials);
    }
    pScene->mNumMeshes = 1;
    ppaVar11 = (aiMesh **)operator_new__(8);
    pScene->mMeshes = ppaVar11;
    *ppaVar11 = this->mGeneratedMesh;
    this->mGeneratedMesh = (aiMesh *)0x0;
    paVar12 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar12);
    pScene->mRootNode = paVar12;
    uVar3 = pScene->mNumMeshes;
    paVar12->mNumMeshes = uVar3;
    puVar13 = (uint *)operator_new__((ulong)uVar3 << 2);
    paVar12->mMeshes = puVar13;
    paVar12 = pScene->mRootNode;
    if (paVar12->mNumMeshes != 0) {
      uVar10 = 0;
      do {
        paVar12->mMeshes[uVar10] = (uint)uVar10;
        uVar10 = uVar10 + 1;
        paVar12 = pScene->mRootNode;
      } while (uVar10 < paVar12->mNumMeshes);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    if ((pointer)local_a8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_a8._0_8_);
    }
    std::vector<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>
    ::~vector((vector<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>
               *)(local_c8 + 8));
    std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>::~vector
              ((vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_> *)local_d8);
    if ((byte *)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != (byte *)0x0) {
      operator_delete(local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((byte *)local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != (byte *)0x0) {
      operator_delete(local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_128.m_cache.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128.m_cache.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    (*pIVar7->_vptr_IOStream[1])(pIVar7);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    return;
  }
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_148,"Invalid .ply file: Unable to extract mesh data ","");
  std::runtime_error::runtime_error(prVar8,(string *)&local_148);
  *(undefined ***)prVar8 = &PTR__runtime_error_0081d260;
  __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void PLYImporter::InternReadFile(const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler) {
    const std::string mode = "rb";
    std::unique_ptr<IOStream> fileStream(pIOHandler->Open(pFile, mode));
    if (!fileStream.get()) {
        throw DeadlyImportError("Failed to open file " + pFile + ".");
    }

    // Get the file-size
    const size_t fileSize( fileStream->FileSize() );
    if ( 0 == fileSize ) {
        throw DeadlyImportError("File " + pFile + " is empty.");
    }

    IOStreamBuffer<char> streamedBuffer(1024 * 1024);
    streamedBuffer.open(fileStream.get());

    // the beginning of the file must be PLY - magic, magic
    std::vector<char> headerCheck;
    streamedBuffer.getNextLine(headerCheck);

    if ((headerCheck.size() < 3) ||
            (headerCheck[0] != 'P' && headerCheck[0] != 'p') ||
            (headerCheck[1] != 'L' && headerCheck[1] != 'l') ||
            (headerCheck[2] != 'Y' && headerCheck[2] != 'y') ) {
        streamedBuffer.close();
        throw DeadlyImportError("Invalid .ply file: Magic number \'ply\' is no there");
    }

    std::vector<char> mBuffer2;
    streamedBuffer.getNextLine(mBuffer2);
    mBuffer = (unsigned char*)&mBuffer2[0];

    char* szMe = (char*)&this->mBuffer[0];
    SkipSpacesAndLineEnd(szMe, (const char**)&szMe);

    // determine the format of the file data and construct the aiMesh
    PLY::DOM sPlyDom;   
    this->pcDOM = &sPlyDom;

    if (TokenMatch(szMe, "format", 6)) {
        if (TokenMatch(szMe, "ascii", 5)) {
            SkipLine(szMe, (const char**)&szMe);
            if (!PLY::DOM::ParseInstance(streamedBuffer, &sPlyDom, this)) {
                if (mGeneratedMesh != nullptr) {
                    delete(mGeneratedMesh);
                    mGeneratedMesh = nullptr;
                }

                streamedBuffer.close();
                throw DeadlyImportError("Invalid .ply file: Unable to build DOM (#1)");
            }
        } else if (!::strncmp(szMe, "binary_", 7)) {
            szMe += 7;
            const bool bIsBE(isBigEndian(szMe));

            // skip the line, parse the rest of the header and build the DOM
            if (!PLY::DOM::ParseInstanceBinary(streamedBuffer, &sPlyDom, this, bIsBE)) {
                if (mGeneratedMesh != nullptr) {
                    delete(mGeneratedMesh);
                    mGeneratedMesh = nullptr;
                }

                streamedBuffer.close();
                throw DeadlyImportError("Invalid .ply file: Unable to build DOM (#2)");
            }
        } else {
            if (mGeneratedMesh != nullptr) {
                delete(mGeneratedMesh);
                mGeneratedMesh = nullptr;
            }

            streamedBuffer.close();
            throw DeadlyImportError("Invalid .ply file: Unknown file format");
        }
    } else {
        AI_DEBUG_INVALIDATE_PTR(this->mBuffer);
        if (mGeneratedMesh != nullptr) {
            delete(mGeneratedMesh);
            mGeneratedMesh = nullptr;
        }

        streamedBuffer.close();
        throw DeadlyImportError("Invalid .ply file: Missing format specification");
    }

    //free the file buffer
    streamedBuffer.close();

    if (mGeneratedMesh == nullptr) {
        throw DeadlyImportError("Invalid .ply file: Unable to extract mesh data ");
    }

    // if no face list is existing we assume that the vertex
    // list is containing a list of points
    bool pointsOnly = mGeneratedMesh->mFaces == nullptr ? true : false;
    if (pointsOnly) {
      mGeneratedMesh->mPrimitiveTypes = aiPrimitiveType::aiPrimitiveType_POINT;
    }

    // now load a list of all materials
    std::vector<aiMaterial*> avMaterials;
    std::string defaultTexture;
    LoadMaterial(&avMaterials, defaultTexture, pointsOnly);

    // now generate the output scene object. Fill the material list
    pScene->mNumMaterials = (unsigned int)avMaterials.size();
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    for (unsigned int i = 0; i < pScene->mNumMaterials; ++i) {
        pScene->mMaterials[i] = avMaterials[i];
    }

    // fill the mesh list
    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    pScene->mMeshes[0] = mGeneratedMesh;
    mGeneratedMesh = nullptr;

    // generate a simple node structure
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mNumMeshes = pScene->mNumMeshes;
    pScene->mRootNode->mMeshes = new unsigned int[pScene->mNumMeshes];

    for (unsigned int i = 0; i < pScene->mRootNode->mNumMeshes; ++i) {
        pScene->mRootNode->mMeshes[i] = i;
    }
}